

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O2

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetFullPath_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  string sStack_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  local_48.View_._M_len = (this->Directory)._M_string_length;
  if (local_48.View_._M_len == 0) {
    GetFullName_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    local_48.View_._M_str = (this->Directory)._M_dataplus._M_p;
    local_78.View_._M_str = local_78.Digits_;
    local_78.View_._M_len = 1;
    local_78.Digits_[0] = '/';
    GetFullName_abi_cxx11_(&sStack_98,this);
    cmStrCat<std::__cxx11::string>(__return_storage_ptr__,&local_48,&local_78,&sStack_98);
    std::__cxx11::string::~string((string *)&sStack_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullPath() const
    {
      return this->Directory.empty()
        ? this->GetFullName()
        : cmStrCat(this->Directory, '/', this->GetFullName());
    }